

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CTypeCheckerVisitor.cpp
# Opt level: O0

void __thiscall CTypeCheckerVisitor::Visit(CTypeCheckerVisitor *this,CIfStm *stm)

{
  bool bVar1;
  pointer pIVar2;
  pointer pIVar3;
  CError local_120;
  TypeInfo local_f0;
  CError local_c8;
  TypeInfo local_98;
  undefined1 local_70 [8];
  string errorMessage;
  TypeInfo local_40;
  CIfStm *local_18;
  CIfStm *stm_local;
  CTypeCheckerVisitor *this_local;
  
  local_18 = stm;
  stm_local = (CIfStm *)this;
  std::operator<<((ostream *)&std::cout,"typechecker: CIfStm\n");
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&local_18->conditionExpression);
  if (((bVar1) &&
      (bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&local_18->positiveStatement),
      bVar1)) &&
     (bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&local_18->negativeStatement),
     bVar1)) {
    pIVar2 = std::unique_ptr<IExpression,_std::default_delete<IExpression>_>::operator->
                       (&local_18->conditionExpression);
    (**(pIVar2->super_PositionedNode).super_INode._vptr_INode)(pIVar2,this);
    TypeInfo::TypeInfo(&local_40,ERROR_TYPE);
    bVar1 = ::operator==(&this->lastCalculatedType,&local_40);
    TypeInfo::~TypeInfo(&local_40);
    if (!bVar1) {
      if ((this->lastCalculatedType).type == BOOLEAN) {
        pIVar3 = std::unique_ptr<IStatement,_std::default_delete<IStatement>_>::operator->
                           (&local_18->positiveStatement);
        (**(pIVar3->super_PositionedNode).super_INode._vptr_INode)(pIVar3,this);
        pIVar3 = std::unique_ptr<IStatement,_std::default_delete<IStatement>_>::operator->
                           (&local_18->negativeStatement);
        (**(pIVar3->super_PositionedNode).super_INode._vptr_INode)(pIVar3,this);
        TypeInfo::TypeInfo(&local_f0,VOID);
        TypeInfo::operator=(&this->lastCalculatedType,&local_f0);
        TypeInfo::~TypeInfo(&local_f0);
      }
      else {
        TypeInfo::TypeInfo(&local_98,BOOLEAN);
        CError::GetTypeErrorMessage_abi_cxx11_
                  ((CError *)local_70,&local_98,&this->lastCalculatedType);
        TypeInfo::~TypeInfo(&local_98);
        pIVar2 = std::unique_ptr<IExpression,_std::default_delete<IExpression>_>::operator->
                           (&local_18->conditionExpression);
        CError::CError(&local_c8,(string *)local_70,&(pIVar2->super_PositionedNode).position);
        std::vector<CError,_std::allocator<CError>_>::push_back(&this->errors,&local_c8);
        CError::~CError(&local_c8);
        std::__cxx11::string::~string((string *)local_70);
      }
    }
  }
  else {
    CError::CError(&local_120,(string *)CError::AST_ERROR_abi_cxx11_,
                   &(local_18->super_IStatement).super_PositionedNode.position);
    std::vector<CError,_std::allocator<CError>_>::push_back(&this->errors,&local_120);
    CError::~CError(&local_120);
  }
  return;
}

Assistant:

void CTypeCheckerVisitor::Visit( CIfStm &stm )
{
    std::cout << "typechecker: CIfStm\n";

    if( stm.conditionExpression && stm.positiveStatement && stm.negativeStatement ) {
		stm.conditionExpression->Accept( *this );
        if( lastCalculatedType == enums::TPrimitiveType::ERROR_TYPE ) {
            return;
        }
		if( lastCalculatedType.type != enums::TPrimitiveType::BOOLEAN ) {
			auto errorMessage = CError::GetTypeErrorMessage( enums::TPrimitiveType::BOOLEAN, lastCalculatedType );
			errors.push_back( CError( errorMessage, stm.conditionExpression->position ) );
            return;
		}
        stm.positiveStatement->Accept( *this );
        stm.negativeStatement->Accept( *this );
        lastCalculatedType = enums::TPrimitiveType::VOID;
    } else {
        errors.push_back( CError( CError::AST_ERROR, stm.position ) );
    }
}